

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

bool google::protobuf::compiler::ApplyMapping
               (string *filename,string *old_prefix,string *new_prefix,string *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  string after_prefix;
  string local_48;
  
  psVar2 = (string *)old_prefix->_M_string_length;
  if (psVar2 == (string *)0x0) {
    bVar4 = ContainsParentReference(filename);
    if (!bVar4) {
      paVar1 = &local_48.field_2;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"/","");
      if (((string *)filename->_M_string_length < local_48._M_string_length) ||
         (iVar5 = std::__cxx11::string::compare
                            ((ulong)filename,0,(string *)local_48._M_string_length), iVar5 != 0)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)result);
        if (result->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)result);
        }
        std::__cxx11::string::_M_append((char *)result,(ulong)(filename->_M_dataplus)._M_p);
        return true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (psVar2 <= (string *)filename->_M_string_length) {
    iVar5 = std::__cxx11::string::compare((ulong)filename,0,psVar2);
    if (iVar5 != 0) {
      return false;
    }
    uVar6 = old_prefix->_M_string_length;
    if (filename->_M_string_length == uVar6) {
      std::__cxx11::string::_M_assign((string *)result);
      return true;
    }
    pcVar3 = (filename->_M_dataplus)._M_p;
    if (pcVar3[uVar6] == '/') {
      uVar6 = (ulong)((int)uVar6 + 1);
    }
    else if (pcVar3[uVar6 - 1] != '/') {
      return false;
    }
    if ((int)uVar6 != -1) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)filename);
      bVar4 = ContainsParentReference(&local_48);
      if (!bVar4) {
        std::__cxx11::string::_M_assign((string *)result);
        if (result->_M_string_length != 0) {
          std::__cxx11::string::push_back((char)result);
        }
        std::__cxx11::string::_M_append((char *)result,(ulong)local_48._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      return !bVar4;
    }
  }
  return false;
}

Assistant:

static bool ApplyMapping(const string& filename,
                         const string& old_prefix,
                         const string& new_prefix,
                         string* result) {
  if (old_prefix.empty()) {
    // old_prefix matches any relative path.
    if (ContainsParentReference(filename)) {
      // We do not allow the file name to use "..".
      return false;
    }
    if (HasPrefixString(filename, "/") ||
        IsWindowsAbsolutePath(filename)) {
      // This is an absolute path, so it isn't matched by the empty string.
      return false;
    }
    result->assign(new_prefix);
    if (!result->empty()) result->push_back('/');
    result->append(filename);
    return true;
  } else if (HasPrefixString(filename, old_prefix)) {
    // old_prefix is a prefix of the filename.  Is it the whole filename?
    if (filename.size() == old_prefix.size()) {
      // Yep, it's an exact match.
      *result = new_prefix;
      return true;
    } else {
      // Not an exact match.  Is the next character a '/'?  Otherwise,
      // this isn't actually a match at all.  E.g. the prefix "foo/bar"
      // does not match the filename "foo/barbaz".
      int after_prefix_start = -1;
      if (filename[old_prefix.size()] == '/') {
        after_prefix_start = old_prefix.size() + 1;
      } else if (filename[old_prefix.size() - 1] == '/') {
        // old_prefix is never empty, and canonicalized paths never have
        // consecutive '/' characters.
        after_prefix_start = old_prefix.size();
      }
      if (after_prefix_start != -1) {
        // Yep.  So the prefixes are directories and the filename is a file
        // inside them.
        string after_prefix = filename.substr(after_prefix_start);
        if (ContainsParentReference(after_prefix)) {
          // We do not allow the file name to use "..".
          return false;
        }
        result->assign(new_prefix);
        if (!result->empty()) result->push_back('/');
        result->append(after_prefix);
        return true;
      }
    }
  }

  return false;
}